

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetExportName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  bool bVar1;
  cmValue input;
  ostream *poVar2;
  string *psVar3;
  ostringstream e;
  string sStack_1b8;
  string local_198 [11];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"EXPORT_NAME",(allocator<char> *)&sStack_1b8);
  input = GetProperty(this,local_198);
  std::__cxx11::string::~string((string *)local_198);
  if ((input.Value == (string *)0x0) || ((input.Value)->_M_string_length == 0)) {
    input.Value = GetName_abi_cxx11_(this);
  }
  else {
    bVar1 = cmGeneratorExpression::IsValidTargetName(input.Value);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      poVar2 = std::operator<<((ostream *)local_198,"EXPORT_NAME property \"");
      poVar2 = std::operator<<(poVar2,(string *)input.Value);
      poVar2 = std::operator<<(poVar2,"\" for \"");
      psVar3 = GetName_abi_cxx11_(this);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      std::operator<<(poVar2,"\": is not valid.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&sStack_1b8);
      std::__cxx11::string::~string((string *)&sStack_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&sStack_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input.Value);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetExportName() const
{
  cmValue exportName = this->GetProperty("EXPORT_NAME");

  if (cmNonempty(exportName)) {
    if (!cmGeneratorExpression::IsValidTargetName(*exportName)) {
      std::ostringstream e;
      e << "EXPORT_NAME property \"" << *exportName << "\" for \""
        << this->GetName() << "\": is not valid.";
      cmSystemTools::Error(e.str());
      return "";
    }
    return *exportName;
  }
  return this->GetName();
}